

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::rangeToString<wchar_t_const*,wchar_t_const*>
          (string *__return_storage_ptr__,Detail *this,wchar_t *first,wchar_t *last)

{
  Detail *value;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  type local_48;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  std::operator<<(local_60.m_oss,"{ ");
  if (this != (Detail *)first) {
    StringMaker<wchar_t,_void>::convert<wchar_t>(&local_48,(wchar_t *)this);
    std::operator<<(local_60.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (value = this + 4; value != (Detail *)first; value = value + 4) {
      std::operator<<(local_60.m_oss,", ");
      StringMaker<wchar_t,_void>::convert<wchar_t>(&local_48,(wchar_t *)value);
      std::operator<<(local_60.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<(local_60.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }